

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *this;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiID id;
  char *str;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  ImRect inner_rect;
  ImVec2 local_38;
  ImVec2 IStack_30;
  ImRect local_28;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  fVar1 = (this->Pos).x;
  fVar2 = (this->Pos).y;
  fVar7 = (this->Size).x + fVar1;
  local_28.Max.y = (this->Size).y + fVar2;
  IVar3 = (this->InnerRect).Min;
  IStack_30 = (this->InnerRect).Max;
  local_38 = IVar3;
  IVar3 = local_38;
  IVar4 = IStack_30;
  if ((uint)axis < 2) {
    fVar8 = (&(this->ScrollbarSizes).x)[(uint)(axis ^ ImGuiAxis_Y)];
    if (0.0 < fVar8) {
      uVar5 = (uint)((&(this->ScrollbarSizes).x)[(uint)axis] <= 0.0) << 3;
      if (axis == ImGuiAxis_X) {
        local_38.x = IVar3.x;
        fVar8 = (local_28.Max.y - this->WindowBorderSize) - fVar8;
        uVar6 = -(uint)(fVar8 <= fVar2);
        local_38.y = (float)(uVar6 & (uint)fVar2 | ~uVar6 & (uint)fVar8);
        uVar5 = uVar5 | 4;
      }
      else {
        fVar8 = (fVar7 - this->WindowBorderSize) - fVar8;
        uVar6 = -(uint)(fVar8 <= fVar1);
        local_38.x = (float)(uVar6 & (uint)fVar1 | ~uVar6 & (uint)fVar8);
        local_38.y = IVar3.y;
        local_28.Max.y = (this->InnerRect).Max.y;
        uVar5 = uVar5 | (uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2;
        IStack_30.x = fVar7;
      }
      local_28.Min.x = local_38.x;
      local_28.Min.y = local_38.y;
      local_28.Max.x = IStack_30.x;
      fVar1 = (&(this->WindowPadding).x)[(uint)axis];
      local_38 = IVar3;
      IStack_30 = IVar4;
      ScrollbarEx(&local_28,id,axis,&(this->Scroll).x + (uint)axis,
                  (&IStack_30.x)[(uint)axis] - (&local_38.x)[(uint)axis],
                  fVar1 + fVar1 + (&(this->ContentSize).x)[(uint)axis],uVar5);
      return;
    }
    __assert_fail("scrollbar_size > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                  ,0x39d,"void ImGui::Scrollbar(ImGuiAxis)");
  }
  __assert_fail("idx <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                ,0xd6,"float &ImVec2::operator[](size_t)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}